

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  undefined2 *puVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  undefined4 in_register_0000003c;
  ulong uVar13;
  char *__s;
  char format [7];
  char local_5f;
  undefined1 local_5e [2];
  undefined1 auStack_5c [4];
  long local_58;
  longdouble local_4c;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_0000003c,precision);
  local_4c = value;
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x9c0,"empty buffer");
  }
  local_38 = (ulong)specs >> 0x20;
  local_5f = '%';
  uVar6 = 5;
  if (-1 < precision) {
    uVar6 = precision - 1;
  }
  bVar9 = specs._4_1_;
  uVar11 = (ulong)uVar6;
  if (1 < bVar9) {
    uVar11 = (ulong)(uint)precision;
  }
  if (bVar9 == 3 && (specs._4_4_ >> 0x14 & 1) != 0) {
    puVar7 = (undefined2 *)(local_5e + 1);
    local_5e[0] = 0x23;
  }
  else {
    puVar7 = (undefined2 *)local_5e;
  }
  if (-1 < (int)uVar11) {
    *puVar7 = 0x2a2e;
    puVar7 = puVar7 + 1;
  }
  *(undefined1 *)puVar7 = 0x4c;
  if (bVar9 == 3) {
    bVar9 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar9 = (bVar9 == 2) + 0x65;
  }
  *(byte *)((long)puVar7 + 1) = bVar9;
  *(undefined1 *)(puVar7 + 1) = 0;
  sVar3 = buf->size_;
  local_58 = sVar3 + 1;
LAB_001114e6:
  while( true ) {
    __s = buf->ptr_ + sVar3;
    uVar10 = buf->capacity_ - sVar3;
    if ((int)uVar11 < 0) {
      uVar6 = snprintf(__s,uVar10,&local_5f);
    }
    else {
      uVar6 = snprintf(__s,uVar10,&local_5f,uVar11);
    }
    uVar13 = (ulong)uVar6;
    if ((int)uVar6 < 0) goto LAB_0011155a;
    if (uVar13 < uVar10) break;
    uVar13 = local_58 + uVar13;
    if (buf->capacity_ < uVar13) goto LAB_00111568;
  }
  if ((char)local_38 == '\x02') {
    if ((int)local_40 == 0) {
      uVar11 = buf->capacity_;
      if (uVar11 < uVar13) {
        (**buf->_vptr_buffer)(buf,uVar13);
        uVar11 = buf->capacity_;
      }
      if (uVar13 <= uVar11) {
        uVar11 = uVar13;
      }
      uVar10 = 0;
      buf->size_ = uVar11;
    }
    else {
      uVar10 = 1;
      do {
        lVar8 = uVar10 + (uVar13 - 2);
        uVar10 = uVar10 - 1;
      } while ((byte)(__s[lVar8] - 0x30U) < 10);
      if (0 < (int)uVar10) {
LAB_00111766:
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                    ,0x146,"negative value");
      }
      memmove(__s + uVar10 + (uVar13 - 1),__s + uVar10 + uVar13,(ulong)(-(int)uVar10 & 0x7fffffff));
      uVar11 = buf->capacity_;
      uVar13 = (ulong)(uVar6 - 1);
      if (uVar11 < uVar13) {
        (**buf->_vptr_buffer)(buf,uVar13);
        uVar11 = buf->capacity_;
      }
      if (uVar11 < uVar13) {
        uVar13 = uVar11;
      }
      buf->size_ = uVar13;
    }
  }
  else if (((uint)local_38 & 0xff) == 3) {
    uVar11 = buf->capacity_;
    uVar13 = sVar3 + uVar13;
    if (uVar11 < uVar13) {
      (**buf->_vptr_buffer)(buf,uVar13);
      uVar11 = buf->capacity_;
    }
    if (uVar11 < uVar13) {
      uVar13 = uVar11;
    }
    uVar10 = 0;
    buf->size_ = uVar13;
  }
  else {
    lVar8 = -2;
    uVar11 = uVar13 - 1;
    do {
      uVar10 = uVar11;
      lVar8 = lVar8 + 1;
      uVar11 = uVar10 - 1;
    } while (__s[uVar10] != 'e');
    cVar2 = __s[uVar10 + 1];
    if ((cVar2 != '+') && (cVar2 != '-')) {
      __assert_fail("sign == \'+\' || sign == \'-\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0xa0e,
                    "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                   );
    }
    lVar8 = -lVar8;
    iVar12 = 0;
    do {
      lVar5 = lVar8 + uVar13;
      if (9 < (byte)(__s[lVar5] - 0x30U)) {
        __assert_fail("is_digit(*p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                      ,0xa12,
                      "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = long double]"
                     );
      }
      lVar8 = lVar8 + 1;
      iVar12 = ((byte)__s[lVar5] - 0x30) + iVar12 * 10;
    } while (lVar8 != 0);
    iVar4 = -iVar12;
    if (cVar2 != '-') {
      iVar4 = iVar12;
    }
    if (uVar11 == 0) {
      uVar11 = 0;
    }
    else {
      do {
        pcVar1 = __s + uVar11;
        uVar11 = uVar11 - 1;
      } while (*pcVar1 == '0');
      if ((int)(uint)uVar11 < 0) goto LAB_00111766;
      memmove(__s + 1,__s + 2,(ulong)((uint)uVar11 & 0x7fffffff));
    }
    uVar13 = local_58 + (uVar11 & 0xffffffff);
    uVar10 = buf->capacity_;
    if (uVar10 < uVar13) {
      (**buf->_vptr_buffer)(buf,uVar13);
      uVar10 = buf->capacity_;
    }
    if (uVar10 < uVar13) {
      uVar13 = uVar10;
    }
    uVar10 = (ulong)(uint)(iVar4 - (int)uVar11);
    buf->size_ = uVar13;
  }
  return (int)uVar10;
LAB_0011155a:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar13 = buf->capacity_ + 1;
LAB_00111568:
    (**buf->_vptr_buffer)(buf,uVar13);
  }
  goto LAB_001114e6;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}